

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O0

int mondesc_resist_flags_to_str(char *buf,uchar flags)

{
  int iVar1;
  int num;
  uchar flags_local;
  char *buf_local;
  
  iVar1 = appendc(buf,(flags & 1) != 0,"fire",0);
  iVar1 = appendc(buf,(flags & 2) != 0,"cold",iVar1);
  iVar1 = appendc(buf,(flags & 4) != 0,"sleep",iVar1);
  iVar1 = appendc(buf,(flags & 8) != 0,"disintegration",iVar1);
  iVar1 = appendc(buf,(flags & 0x10) != 0,"shock",iVar1);
  iVar1 = appendc(buf,(flags & 0x20) != 0,"poison",iVar1);
  iVar1 = appendc(buf,(flags & 0x40) != 0,"acid",iVar1);
  iVar1 = appendc(buf,(flags & 0x80) != 0,"petrification",iVar1);
  return iVar1;
}

Assistant:

static int mondesc_resist_flags_to_str(char *buf, uchar flags)
{
    int num = 0;
    num = appendc(buf, !!(flags & MR_FIRE), "fire", num);
    num = appendc(buf, !!(flags & MR_COLD), "cold", num);
    num = appendc(buf, !!(flags & MR_SLEEP), "sleep", num);
    num = appendc(buf, !!(flags & MR_DISINT), "disintegration", num);
    num = appendc(buf, !!(flags & MR_ELEC), "shock", num);
    num = appendc(buf, !!(flags & MR_POISON), "poison", num);
    num = appendc(buf, !!(flags & MR_ACID), "acid", num);
    num = appendc(buf, !!(flags & MR_STONE), "petrification", num);
    return num;
}